

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O1

bool tinyusdz::tydra::GetBoundMaterial
               (Stage *_stage,Path *abs_path,string *materialPurpose,Path *materialPath,
               Material **material,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Material *pMVar5;
  uint uVar6;
  char cVar7;
  Token *purpose;
  Prim *prim;
  Material *directMaterial;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> purposes;
  string _err;
  Path parentPath;
  Path boundMaterialPath;
  Path currentPath;
  string *local_358;
  Prim *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  Material *local_328;
  Material *local_320;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_318;
  string local_2f8;
  Path local_2d8;
  Path *local_208;
  Material **local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  string *local_1e8;
  Path *local_1e0;
  string *local_1d8;
  Path local_1d0;
  Path local_100;
  
  if (material == (Material **)0x0 || materialPath == (Path *)0x0) {
    bVar3 = false;
  }
  else {
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_100._prim_part.field_2;
    local_208 = materialPath;
    local_200 = material;
    local_1e0 = abs_path;
    if (materialPurpose->_M_string_length != 0) {
      local_100._prim_part._M_string_length = 0;
      local_100._prim_part.field_2._M_local_buf[0] = '\0';
      local_100._prim_part._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_assign((string *)&local_100);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
      emplace_back<tinyusdz::Token>(&local_318,(Token *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_100._prim_part.field_2._M_local_buf[0]) + 1);
      }
    }
    local_100._prim_part._M_string_length = 0;
    local_100._prim_part.field_2._M_local_buf[0] = '\0';
    local_100._prim_part._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x6208e3);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::emplace_back<tinyusdz::Token>
              (&local_318,(Token *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._prim_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._prim_part._M_dataplus._M_p,
                      CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_100._prim_part.field_2._M_local_buf[0]) + 1);
    }
    local_358 = &(local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start)->str_;
    local_1e8 = &(local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->str_;
    if (local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_318.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_330 = &local_1d0._variant_part_str.field_2;
      local_338 = &local_1d0._element.field_2;
      paVar1 = &local_2d8._variant_part_str.field_2;
      paVar4 = &local_2d8._element.field_2;
      local_1f8 = &local_100._element.field_2;
      local_1f0 = &local_100._variant_part_str.field_2;
      bVar3 = false;
      local_1d8 = err;
      do {
        Path::Path(&local_100,local_1e0);
        local_1d0._prim_part._M_string_length = 0;
        local_1d0._prim_part.field_2._M_local_buf[0] = '\0';
        local_1d0._prop_part._M_string_length = 0;
        local_1d0._prop_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_part._M_dataplus._M_p = (pointer)&local_1d0._variant_part.field_2;
        local_1d0._variant_part._M_string_length = 0;
        local_1d0._variant_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_selection_part._M_dataplus._M_p =
             (pointer)&local_1d0._variant_selection_part.field_2;
        local_1d0._variant_selection_part._M_string_length = 0;
        local_1d0._variant_selection_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_part_str._M_dataplus._M_p = (pointer)local_330;
        local_1d0._variant_part_str._M_string_length = 0;
        local_1d0._variant_part_str.field_2._M_local_buf[0] = '\0';
        local_1d0._element._M_dataplus._M_p = (pointer)local_338;
        local_1d0._element._M_string_length = 0;
        local_1d0._element.field_2._M_local_buf[0] = '\0';
        local_1d0._path_type.has_value_ = false;
        local_1d0._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_1d0._valid = false;
        pMVar5 = (Material *)0x0;
        uVar6 = 0;
        local_1d0._prim_part._M_dataplus._M_p = (pointer)&local_1d0._prim_part.field_2;
        local_1d0._prop_part._M_dataplus._M_p = (pointer)&local_1d0._prop_part.field_2;
        do {
          if (((0x1ffff < uVar6) || (local_100._valid != true)) ||
             ((local_100._prim_part._M_string_length == 1 &&
              (*local_100._prim_part._M_dataplus._M_p == '/')))) goto LAB_005cd3c9;
          local_340 = (Prim *)0x0;
          bVar2 = Stage::find_prim_at_path(_stage,&local_100,&local_340,err);
          cVar7 = '\x01';
          if (bVar2) {
            if ((pMVar5 == (Material *)0x0) ||
               (bVar2 = DirectBindingStrongerThanDescendants(_stage,local_340,local_358), bVar2)) {
              local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
              local_2f8._M_string_length = 0;
              local_2f8.field_2._M_local_buf[0] = '\0';
              local_2d8._prim_part._M_dataplus._M_p = (pointer)&local_2d8._prim_part.field_2;
              local_2d8._prim_part._M_string_length = 0;
              local_2d8._prim_part.field_2._M_local_buf[0] = '\0';
              local_2d8._prop_part._M_dataplus._M_p = (pointer)&local_2d8._prop_part.field_2;
              local_2d8._prop_part._M_string_length = 0;
              local_2d8._prop_part.field_2._M_local_buf[0] = '\0';
              local_2d8._variant_part._M_dataplus._M_p = (pointer)&local_2d8._variant_part.field_2;
              local_2d8._variant_part._M_string_length = 0;
              local_2d8._variant_part.field_2._M_local_buf[0] = '\0';
              local_2d8._variant_selection_part._M_dataplus._M_p =
                   (pointer)&local_2d8._variant_selection_part.field_2;
              local_2d8._variant_selection_part._M_string_length = 0;
              local_2d8._variant_selection_part.field_2._M_local_buf[0] = '\0';
              local_2d8._variant_part_str._M_string_length = 0;
              local_2d8._variant_part_str.field_2._M_local_buf[0] = '\0';
              local_2d8._element._M_string_length = 0;
              local_2d8._element.field_2._M_local_buf[0] = '\0';
              local_2d8._path_type.has_value_ = false;
              local_2d8._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
              local_2d8._valid = false;
              local_320 = (Material *)0x0;
              local_328 = pMVar5;
              local_2d8._variant_part_str._M_dataplus._M_p = (pointer)paVar1;
              local_2d8._element._M_dataplus._M_p = (pointer)paVar4;
              bVar2 = GetDirectlyBoundMaterial
                                (_stage,local_340,local_358,&local_2d8,&local_320,&local_2f8);
              pMVar5 = local_320;
              if (local_320 == (Material *)0x0 || !bVar2) {
                bVar2 = local_2f8._M_string_length == 0;
                if (err != (string *)0x0 && !bVar2) {
                  ::std::__cxx11::string::_M_append((char *)err,(ulong)local_2f8._M_dataplus._M_p);
                  bVar3 = false;
                }
                else {
                  bVar3 = (bool)(bVar3 & bVar2);
                }
                bVar2 = (err == (string *)0x0 || bVar2) && bVar2;
                pMVar5 = local_328;
              }
              else {
                Path::operator=(&local_1d0,&local_2d8);
                bVar2 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._element._M_dataplus._M_p != paVar4) {
                operator_delete(local_2d8._element._M_dataplus._M_p,
                                CONCAT71(local_2d8._element.field_2._M_allocated_capacity._1_7_,
                                         local_2d8._element.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._variant_part_str._M_dataplus._M_p != paVar1) {
                operator_delete(local_2d8._variant_part_str._M_dataplus._M_p,
                                CONCAT71(local_2d8._variant_part_str.field_2._M_allocated_capacity.
                                         _1_7_,local_2d8._variant_part_str.field_2._M_local_buf[0])
                                + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._variant_selection_part._M_dataplus._M_p !=
                  &local_2d8._variant_selection_part.field_2) {
                operator_delete(local_2d8._variant_selection_part._M_dataplus._M_p,
                                CONCAT71(local_2d8._variant_selection_part.field_2.
                                         _M_allocated_capacity._1_7_,
                                         local_2d8._variant_selection_part.field_2._M_local_buf[0])
                                + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._variant_part._M_dataplus._M_p != &local_2d8._variant_part.field_2) {
                operator_delete(local_2d8._variant_part._M_dataplus._M_p,
                                CONCAT71(local_2d8._variant_part.field_2._M_allocated_capacity._1_7_
                                         ,local_2d8._variant_part.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._prop_part._M_dataplus._M_p != &local_2d8._prop_part.field_2) {
                operator_delete(local_2d8._prop_part._M_dataplus._M_p,
                                CONCAT71(local_2d8._prop_part.field_2._M_allocated_capacity._1_7_,
                                         local_2d8._prop_part.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._prim_part._M_dataplus._M_p != &local_2d8._prim_part.field_2) {
                operator_delete(local_2d8._prim_part._M_dataplus._M_p,
                                CONCAT71(local_2d8._prim_part.field_2._M_allocated_capacity._1_7_,
                                         local_2d8._prim_part.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                         local_2f8.field_2._M_local_buf[0]) + 1);
              }
              err = local_1d8;
              if (!bVar2) goto LAB_005cd3ba;
            }
            Path::get_parent_prim_path(&local_2d8,&local_100);
            Path::operator=(&local_100,&local_2d8);
            bVar2 = Path::is_root_prim(&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._element._M_dataplus._M_p != paVar4) {
              operator_delete(local_2d8._element._M_dataplus._M_p,
                              CONCAT71(local_2d8._element.field_2._M_allocated_capacity._1_7_,
                                       local_2d8._element.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._variant_part_str._M_dataplus._M_p != paVar1) {
              operator_delete(local_2d8._variant_part_str._M_dataplus._M_p,
                              CONCAT71(local_2d8._variant_part_str.field_2._M_allocated_capacity.
                                       _1_7_,local_2d8._variant_part_str.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._variant_selection_part._M_dataplus._M_p !=
                &local_2d8._variant_selection_part.field_2) {
              operator_delete(local_2d8._variant_selection_part._M_dataplus._M_p,
                              CONCAT71(local_2d8._variant_selection_part.field_2.
                                       _M_allocated_capacity._1_7_,
                                       local_2d8._variant_selection_part.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._variant_part._M_dataplus._M_p != &local_2d8._variant_part.field_2) {
              operator_delete(local_2d8._variant_part._M_dataplus._M_p,
                              CONCAT71(local_2d8._variant_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d8._variant_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._prop_part._M_dataplus._M_p != &local_2d8._prop_part.field_2) {
              operator_delete(local_2d8._prop_part._M_dataplus._M_p,
                              CONCAT71(local_2d8._prop_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d8._prop_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._prim_part._M_dataplus._M_p != &local_2d8._prim_part.field_2) {
              operator_delete(local_2d8._prim_part._M_dataplus._M_p,
                              CONCAT71(local_2d8._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d8._prim_part.field_2._M_local_buf[0]) + 1);
            }
            uVar6 = uVar6 + !bVar2;
            cVar7 = bVar2 * '\x05';
          }
          else {
            bVar3 = false;
          }
LAB_005cd3ba:
        } while (cVar7 == '\0');
        if (cVar7 == '\x05') {
LAB_005cd3c9:
          if (pMVar5 != (Material *)0x0) {
            *local_200 = pMVar5;
            Path::operator=(local_208,&local_1d0);
            bVar3 = true;
            goto LAB_005cd3f4;
          }
          bVar2 = true;
        }
        else {
LAB_005cd3f4:
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._element._M_dataplus._M_p != local_338) {
          operator_delete(local_1d0._element._M_dataplus._M_p,
                          CONCAT71(local_1d0._element.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._element.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_part_str._M_dataplus._M_p != local_330) {
          operator_delete(local_1d0._variant_part_str._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_part_str.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._variant_part_str.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_selection_part._M_dataplus._M_p !=
            &local_1d0._variant_selection_part.field_2) {
          operator_delete(local_1d0._variant_selection_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_selection_part.field_2._M_allocated_capacity.
                                   _1_7_,local_1d0._variant_selection_part.field_2._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_part._M_dataplus._M_p != &local_1d0._variant_part.field_2) {
          operator_delete(local_1d0._variant_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._variant_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._prop_part._M_dataplus._M_p != &local_1d0._prop_part.field_2) {
          operator_delete(local_1d0._prop_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._prop_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._prop_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._prim_part._M_dataplus._M_p != &local_1d0._prim_part.field_2) {
          operator_delete(local_1d0._prim_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._element._M_dataplus._M_p != local_1f8) {
          operator_delete(local_100._element._M_dataplus._M_p,
                          local_100._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part_str._M_dataplus._M_p != local_1f0) {
          operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                          local_100._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_selection_part._M_dataplus._M_p !=
            &local_100._variant_selection_part.field_2) {
          operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                          local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
          operator_delete(local_100._variant_part._M_dataplus._M_p,
                          local_100._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
          operator_delete(local_100._prop_part._M_dataplus._M_p,
                          local_100._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar2) goto LAB_005cd5d1;
        local_358 = local_358 + 1;
      } while (local_358 != local_1e8);
    }
    bVar3 = false;
LAB_005cd5d1:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_318);
  }
  return bVar3;
}

Assistant:

bool GetBoundMaterial(
  const Stage &_stage,
  const Path &abs_path,
  const std::string &materialPurpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (materialPath == nullptr) {
    return false;
  }

  if (material == nullptr) {
    return false;
  }

  std::vector<value::token> purposes;
  if (materialPurpose.empty()) {
    purposes.push_back(value::token("")); // all-purpose
  } else {
    purposes.push_back(value::token(materialPurpose));
    purposes.push_back(value::token("")); // all-purpose
  }

  // for purpose : purposes:
  //
  //   boundMaterial = None
  //
  //   for p = prim, p != Root, p = p.GetParent():
  //
  //     if DirectBindingStrongerThanDescendants(p, purpose) or not boundMaterial:
  //
  //       if dicrectBind = GetDirectlyBoundMaterial(p, purpose):
  //
  //         boundMaterial = directBound
  //
  //     for collBinding : GetCollectionMaterialBindings(p, purpose):
  //
  //       if (collBinding.GetCollection().Contains(prim) and
  //           collBinding.IsStrongerThanDescendants() or not boundMaterial):
  //
  //         boundMaterial = collBinding.GetMaterial()
  //         break
  //
  //
  //   if boundMaterial:
  //     return boundMaterial
  //
  //
  // return False(or return default material)

  for (const auto &purpose : purposes) {

    Path currentPath = abs_path;
    Path boundMaterialPath;
    const Material *boundMaterial{nullptr};

    // We need to climb up to the root in any case.
    // TODO: Cache result.
    uint32_t depth = 0;
    while (depth < 1024*128) { // to avoid infinite loop.

      if (!currentPath.is_valid() || currentPath.is_root_path()) {
        break;
      }

      const Prim *prim{nullptr};
      bool ret = _stage.find_prim_at_path(currentPath, prim, err);
      if (!ret) {
        return false;
      }

      if (!boundMaterial || DirectBindingStrongerThanDescendants(_stage, *prim, purpose.str())) {

        std::string _err;
        Path directMaterialPath;
        const Material *directMaterial{nullptr};
        bool has_directBound = GetDirectlyBoundMaterial(_stage, *prim, purpose.str(), &directMaterialPath, &directMaterial, &_err);

        if (has_directBound && directMaterial) {

          boundMaterial = directMaterial;
          boundMaterialPath = directMaterialPath;
        
        } else if (_err.size()) {
          if (err) {
            (*err) += _err;
          }
          return false;
        }
      }

      Path parentPath = currentPath.get_parent_prim_path();
      DCOUT("search parent: " << parentPath.full_path_name());

      currentPath = parentPath;

      if (currentPath.is_root_prim()) {
        // parent is root('/'), so no need to follow the parent path anymore.
        break;
      }

      depth++;

      // TODO: collection
    }

    if (boundMaterial) {
      (*material) = boundMaterial;
      (*materialPath) = boundMaterialPath;
      return true;
    }
  }

  return false;
}